

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-ni.c
# Opt level: O0

void sha256_ni_block(__m128i *core,uint8_t *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i MASK;
  __m128i *block;
  __m128i MSG3;
  __m128i MSG2;
  __m128i MSG1;
  __m128i MSG0;
  __m128i TMP;
  __m128i MSG;
  __m128i STATE1;
  __m128i STATE0;
  uint8_t *p_local;
  __m128i *core_local;
  int local_cc8;
  int iStack_cc4;
  int iStack_cc0;
  int iStack_cbc;
  int local_cb8;
  int iStack_cb4;
  int iStack_cb0;
  int iStack_cac;
  int local_ca8;
  int iStack_ca4;
  int iStack_ca0;
  int iStack_c9c;
  int local_c98;
  int iStack_c94;
  int iStack_c90;
  int iStack_c8c;
  int local_c78;
  int iStack_c74;
  int iStack_c70;
  int iStack_c6c;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  int local_c38;
  int iStack_c34;
  int iStack_c30;
  int iStack_c2c;
  int local_c18;
  int iStack_c14;
  int iStack_c10;
  int iStack_c0c;
  int local_bf8;
  int iStack_bf4;
  int iStack_bf0;
  int iStack_bec;
  int local_bd8;
  int iStack_bd4;
  int iStack_bd0;
  int iStack_bcc;
  int local_bb8;
  int iStack_bb4;
  int iStack_bb0;
  int iStack_bac;
  int local_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  int local_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int local_b58;
  int iStack_b54;
  int iStack_b50;
  int iStack_b4c;
  int local_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  int local_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int local_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int local_ad8;
  int iStack_ad4;
  int iStack_ad0;
  int iStack_acc;
  int local_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  int local_a98;
  int iStack_a94;
  int iStack_a90;
  int iStack_a8c;
  int local_a78;
  int iStack_a74;
  int iStack_a70;
  int iStack_a6c;
  int local_a58;
  int iStack_a54;
  int iStack_a50;
  int iStack_a4c;
  int local_a38;
  int iStack_a34;
  int iStack_a30;
  int iStack_a2c;
  int local_a18;
  int iStack_a14;
  int iStack_a10;
  int iStack_a0c;
  int local_9f8;
  int iStack_9f4;
  int iStack_9f0;
  int iStack_9ec;
  int local_9d8;
  int iStack_9d4;
  int iStack_9d0;
  int iStack_9cc;
  int local_9b8;
  int iStack_9b4;
  int iStack_9b0;
  int iStack_9ac;
  int local_998;
  int iStack_994;
  int iStack_990;
  int iStack_98c;
  int local_978;
  int iStack_974;
  int iStack_970;
  int iStack_96c;
  int local_958;
  int iStack_954;
  int iStack_950;
  int iStack_94c;
  int local_938;
  int iStack_934;
  int iStack_930;
  int iStack_92c;
  int local_918;
  int iStack_914;
  int iStack_910;
  int iStack_90c;
  
  auVar47._8_8_ = 0xc0d0e0f08090a0b;
  auVar47._0_8_ = 0x405060700010203;
  auVar44 = pshufb(*(undefined1 (*) [16])p,auVar47);
  local_918 = auVar44._0_4_;
  iStack_914 = auVar44._4_4_;
  iStack_910 = auVar44._8_4_;
  iStack_90c = auVar44._12_4_;
  local_918 = local_918 + 0x428a2f98;
  TMP[1] = CONCAT44(iStack_914 + 0x71374491,local_918);
  MSG[0] = CONCAT44(iStack_90c + -0x164a245b,iStack_910 + -0x4a3f0431);
  auVar30._8_8_ = MSG[0];
  auVar30._0_8_ = TMP[1];
  auVar46 = sha256rnds2_sha((undefined1  [16])core[1],(undefined1  [16])*core,auVar30);
  TMP[1] = CONCAT44(iStack_90c + -0x164a245b,iStack_910 + -0x4a3f0431);
  MSG[0] = CONCAT44(local_918,local_918);
  auVar29._8_8_ = MSG[0];
  auVar29._0_8_ = TMP[1];
  auVar47 = sha256rnds2_sha((undefined1  [16])*core,auVar46,auVar29);
  auVar45._8_8_ = 0xc0d0e0f08090a0b;
  auVar45._0_8_ = 0x405060700010203;
  auVar45 = pshufb(*(undefined1 (*) [16])(p + 0x10),auVar45);
  local_938 = auVar45._0_4_;
  iStack_934 = auVar45._4_4_;
  iStack_930 = auVar45._8_4_;
  iStack_92c = auVar45._12_4_;
  local_938 = local_938 + 0x3956c25b;
  TMP[1] = CONCAT44(iStack_934 + 0x59f111f1,local_938);
  MSG[0] = CONCAT44(iStack_92c + -0x54e3a12b,iStack_930 + -0x6dc07d5c);
  auVar28._8_8_ = MSG[0];
  auVar28._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar46,auVar47,auVar28);
  TMP[1] = CONCAT44(iStack_92c + -0x54e3a12b,iStack_930 + -0x6dc07d5c);
  MSG[0] = CONCAT44(local_938,local_938);
  auVar27._8_8_ = MSG[0];
  auVar27._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar47,auVar48,auVar27);
  auVar47 = sha256msg1_sha(auVar44,auVar45);
  auVar46._8_8_ = 0xc0d0e0f08090a0b;
  auVar46._0_8_ = 0x405060700010203;
  auVar46 = pshufb(*(undefined1 (*) [16])(p + 0x20),auVar46);
  local_958 = auVar46._0_4_;
  iStack_954 = auVar46._4_4_;
  iStack_950 = auVar46._8_4_;
  iStack_94c = auVar46._12_4_;
  local_958 = local_958 + -0x27f85568;
  TMP[1] = CONCAT44(iStack_954 + 0x12835b01,local_958);
  MSG[0] = CONCAT44(iStack_94c + 0x550c7dc3,iStack_950 + 0x243185be);
  auVar26._8_8_ = MSG[0];
  auVar26._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar26);
  TMP[1] = CONCAT44(iStack_94c + 0x550c7dc3,iStack_950 + 0x243185be);
  MSG[0] = CONCAT44(local_958,local_958);
  auVar25._8_8_ = MSG[0];
  auVar25._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar25);
  auVar45 = sha256msg1_sha(auVar45,auVar46);
  auVar44._8_8_ = 0xc0d0e0f08090a0b;
  auVar44._0_8_ = 0x405060700010203;
  auVar44 = pshufb(*(undefined1 (*) [16])(p + 0x30),auVar44);
  local_978 = auVar44._0_4_;
  iStack_974 = auVar44._4_4_;
  iStack_970 = auVar44._8_4_;
  iStack_96c = auVar44._12_4_;
  iVar43 = local_978 + 0x72be5d74;
  TMP[1] = CONCAT44(iStack_974 + -0x7f214e02,iVar43);
  MSG[0] = CONCAT44(iStack_96c + -0x3e640e8c,iStack_970 + -0x6423f959);
  auVar24._8_8_ = MSG[0];
  auVar24._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar24);
  local_998 = auVar47._0_4_;
  iStack_994 = auVar47._4_4_;
  iStack_990 = auVar47._8_4_;
  iStack_98c = auVar47._12_4_;
  MSG1[1] = CONCAT44(iStack_994 + iStack_950,local_998 + iStack_954);
  MSG0[0]._0_4_ = iStack_990 + iStack_94c;
  MSG0[0]._4_4_ = iStack_98c + local_978;
  auVar42._8_8_ = MSG0[0];
  auVar42._0_8_ = MSG1[1];
  auVar47 = sha256msg2_sha(auVar42,auVar44);
  TMP[1] = CONCAT44(iStack_96c + -0x3e640e8c,iStack_970 + -0x6423f959);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar23._8_8_ = MSG[0];
  auVar23._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar23);
  auVar46 = sha256msg1_sha(auVar46,auVar44);
  local_9b8 = auVar47._0_4_;
  iStack_9b4 = auVar47._4_4_;
  iStack_9b0 = auVar47._8_4_;
  iStack_9ac = auVar47._12_4_;
  iVar43 = local_9b8 + -0x1b64963f;
  TMP[1] = CONCAT44(iStack_9b4 + -0x1041b87a,iVar43);
  MSG[0] = CONCAT44(iStack_9ac + 0x240ca1cc,iStack_9b0 + 0xfc19dc6);
  auVar22._8_8_ = MSG[0];
  auVar22._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar22);
  local_9d8 = auVar45._0_4_;
  iStack_9d4 = auVar45._4_4_;
  iStack_9d0 = auVar45._8_4_;
  iStack_9cc = auVar45._12_4_;
  MSG2[1] = CONCAT44(iStack_9d4 + iStack_970,local_9d8 + iStack_974);
  MSG1[0]._0_4_ = iStack_9d0 + iStack_96c;
  MSG1[0]._4_4_ = iStack_9cc + local_9b8;
  auVar41._8_8_ = MSG1[0];
  auVar41._0_8_ = MSG2[1];
  auVar45 = sha256msg2_sha(auVar41,auVar47);
  TMP[1] = CONCAT44(iStack_9ac + 0x240ca1cc,iStack_9b0 + 0xfc19dc6);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar21._8_8_ = MSG[0];
  auVar21._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar21);
  auVar44 = sha256msg1_sha(auVar44,auVar47);
  local_9f8 = auVar45._0_4_;
  iStack_9f4 = auVar45._4_4_;
  iStack_9f0 = auVar45._8_4_;
  iStack_9ec = auVar45._12_4_;
  iVar43 = local_9f8 + 0x2de92c6f;
  TMP[1] = CONCAT44(iStack_9f4 + 0x4a7484aa,iVar43);
  MSG[0] = CONCAT44(iStack_9ec + 0x76f988da,iStack_9f0 + 0x5cb0a9dc);
  auVar20._8_8_ = MSG[0];
  auVar20._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar20);
  local_a18 = auVar46._0_4_;
  iStack_a14 = auVar46._4_4_;
  iStack_a10 = auVar46._8_4_;
  iStack_a0c = auVar46._12_4_;
  MSG3[1] = CONCAT44(iStack_a14 + iStack_9b0,local_a18 + iStack_9b4);
  MSG2[0]._0_4_ = iStack_a10 + iStack_9ac;
  MSG2[0]._4_4_ = iStack_a0c + local_9f8;
  auVar40._8_8_ = MSG2[0];
  auVar40._0_8_ = MSG3[1];
  auVar46 = sha256msg2_sha(auVar40,auVar45);
  TMP[1] = CONCAT44(iStack_9ec + 0x76f988da,iStack_9f0 + 0x5cb0a9dc);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar19._8_8_ = MSG[0];
  auVar19._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar19);
  auVar47 = sha256msg1_sha(auVar47,auVar45);
  local_a38 = auVar46._0_4_;
  iStack_a34 = auVar46._4_4_;
  iStack_a30 = auVar46._8_4_;
  iStack_a2c = auVar46._12_4_;
  iVar43 = local_a38 + -0x67c1aeae;
  TMP[1] = CONCAT44(iStack_a34 + -0x57ce3993,iVar43);
  MSG[0] = CONCAT44(iStack_a2c + -0x40a68039,iStack_a30 + -0x4ffcd838);
  auVar18._8_8_ = MSG[0];
  auVar18._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar18);
  local_a58 = auVar44._0_4_;
  iStack_a54 = auVar44._4_4_;
  iStack_a50 = auVar44._8_4_;
  iStack_a4c = auVar44._12_4_;
  block = (__m128i *)CONCAT44(iStack_a54 + iStack_9f0,local_a58 + iStack_9f4);
  MSG3[0]._0_4_ = iStack_a50 + iStack_9ec;
  MSG3[0]._4_4_ = iStack_a4c + local_a38;
  auVar39._8_8_ = MSG3[0];
  auVar39._0_8_ = block;
  auVar44 = sha256msg2_sha(auVar39,auVar46);
  TMP[1] = CONCAT44(iStack_a2c + -0x40a68039,iStack_a30 + -0x4ffcd838);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar17._8_8_ = MSG[0];
  auVar17._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar17);
  auVar45 = sha256msg1_sha(auVar45,auVar46);
  local_a78 = auVar44._0_4_;
  iStack_a74 = auVar44._4_4_;
  iStack_a70 = auVar44._8_4_;
  iStack_a6c = auVar44._12_4_;
  iVar43 = local_a78 + -0x391ff40d;
  TMP[1] = CONCAT44(iStack_a74 + -0x2a586eb9,iVar43);
  MSG[0] = CONCAT44(iStack_a6c + 0x14292967,iStack_a70 + 0x6ca6351);
  auVar16._8_8_ = MSG[0];
  auVar16._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar16);
  local_a98 = auVar47._0_4_;
  iStack_a94 = auVar47._4_4_;
  iStack_a90 = auVar47._8_4_;
  iStack_a8c = auVar47._12_4_;
  MSG1[1] = CONCAT44(iStack_a94 + iStack_a30,local_a98 + iStack_a34);
  MSG0[0]._0_4_ = iStack_a90 + iStack_a2c;
  MSG0[0]._4_4_ = iStack_a8c + local_a78;
  auVar38._8_8_ = MSG0[0];
  auVar38._0_8_ = MSG1[1];
  auVar47 = sha256msg2_sha(auVar38,auVar44);
  TMP[1] = CONCAT44(iStack_a6c + 0x14292967,iStack_a70 + 0x6ca6351);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar15._8_8_ = MSG[0];
  auVar15._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar15);
  auVar46 = sha256msg1_sha(auVar46,auVar44);
  local_ab8 = auVar47._0_4_;
  iStack_ab4 = auVar47._4_4_;
  iStack_ab0 = auVar47._8_4_;
  iStack_aac = auVar47._12_4_;
  iVar43 = local_ab8 + 0x27b70a85;
  TMP[1] = CONCAT44(iStack_ab4 + 0x2e1b2138,iVar43);
  MSG[0] = CONCAT44(iStack_aac + 0x53380d13,iStack_ab0 + 0x4d2c6dfc);
  auVar14._8_8_ = MSG[0];
  auVar14._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar14);
  local_ad8 = auVar45._0_4_;
  iStack_ad4 = auVar45._4_4_;
  iStack_ad0 = auVar45._8_4_;
  iStack_acc = auVar45._12_4_;
  MSG2[1] = CONCAT44(iStack_ad4 + iStack_a70,local_ad8 + iStack_a74);
  MSG1[0]._0_4_ = iStack_ad0 + iStack_a6c;
  MSG1[0]._4_4_ = iStack_acc + local_ab8;
  auVar37._8_8_ = MSG1[0];
  auVar37._0_8_ = MSG2[1];
  auVar45 = sha256msg2_sha(auVar37,auVar47);
  TMP[1] = CONCAT44(iStack_aac + 0x53380d13,iStack_ab0 + 0x4d2c6dfc);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar13._8_8_ = MSG[0];
  auVar13._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar13);
  auVar44 = sha256msg1_sha(auVar44,auVar47);
  local_af8 = auVar45._0_4_;
  iStack_af4 = auVar45._4_4_;
  iStack_af0 = auVar45._8_4_;
  iStack_aec = auVar45._12_4_;
  iVar43 = local_af8 + 0x650a7354;
  TMP[1] = CONCAT44(iStack_af4 + 0x766a0abb,iVar43);
  MSG[0] = CONCAT44(iStack_aec + -0x6d8dd37b,iStack_af0 + -0x7e3d36d2);
  auVar12._8_8_ = MSG[0];
  auVar12._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar12);
  local_b18 = auVar46._0_4_;
  iStack_b14 = auVar46._4_4_;
  iStack_b10 = auVar46._8_4_;
  iStack_b0c = auVar46._12_4_;
  MSG3[1] = CONCAT44(iStack_b14 + iStack_ab0,local_b18 + iStack_ab4);
  MSG2[0]._0_4_ = iStack_b10 + iStack_aac;
  MSG2[0]._4_4_ = iStack_b0c + local_af8;
  auVar36._8_8_ = MSG2[0];
  auVar36._0_8_ = MSG3[1];
  auVar46 = sha256msg2_sha(auVar36,auVar45);
  TMP[1] = CONCAT44(iStack_aec + -0x6d8dd37b,iStack_af0 + -0x7e3d36d2);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar11._8_8_ = MSG[0];
  auVar11._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar11);
  auVar47 = sha256msg1_sha(auVar47,auVar45);
  local_b38 = auVar46._0_4_;
  iStack_b34 = auVar46._4_4_;
  iStack_b30 = auVar46._8_4_;
  iStack_b2c = auVar46._12_4_;
  iVar43 = local_b38 + -0x5d40175f;
  TMP[1] = CONCAT44(iStack_b34 + -0x57e599b5,iVar43);
  MSG[0] = CONCAT44(iStack_b2c + -0x3893ae5d,iStack_b30 + -0x3db47490);
  auVar10._8_8_ = MSG[0];
  auVar10._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar10);
  local_b58 = auVar44._0_4_;
  iStack_b54 = auVar44._4_4_;
  iStack_b50 = auVar44._8_4_;
  iStack_b4c = auVar44._12_4_;
  block = (__m128i *)CONCAT44(iStack_b54 + iStack_af0,local_b58 + iStack_af4);
  MSG3[0]._0_4_ = iStack_b50 + iStack_aec;
  MSG3[0]._4_4_ = iStack_b4c + local_b38;
  auVar35._8_8_ = MSG3[0];
  auVar35._0_8_ = block;
  auVar44 = sha256msg2_sha(auVar35,auVar46);
  TMP[1] = CONCAT44(iStack_b2c + -0x3893ae5d,iStack_b30 + -0x3db47490);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar9._8_8_ = MSG[0];
  auVar9._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar9);
  auVar45 = sha256msg1_sha(auVar45,auVar46);
  local_b78 = auVar44._0_4_;
  iStack_b74 = auVar44._4_4_;
  iStack_b70 = auVar44._8_4_;
  iStack_b6c = auVar44._12_4_;
  iVar43 = local_b78 + -0x2e6d17e7;
  TMP[1] = CONCAT44(iStack_b74 + -0x2966f9dc,iVar43);
  MSG[0] = CONCAT44(iStack_b6c + 0x106aa070,iStack_b70 + -0xbf1ca7b);
  auVar8._8_8_ = MSG[0];
  auVar8._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar8);
  local_b98 = auVar47._0_4_;
  iStack_b94 = auVar47._4_4_;
  iStack_b90 = auVar47._8_4_;
  iStack_b8c = auVar47._12_4_;
  MSG1[1] = CONCAT44(iStack_b94 + iStack_b30,local_b98 + iStack_b34);
  MSG0[0]._0_4_ = iStack_b90 + iStack_b2c;
  MSG0[0]._4_4_ = iStack_b8c + local_b78;
  auVar34._8_8_ = MSG0[0];
  auVar34._0_8_ = MSG1[1];
  auVar47 = sha256msg2_sha(auVar34,auVar44);
  TMP[1] = CONCAT44(iStack_b6c + 0x106aa070,iStack_b70 + -0xbf1ca7b);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar7._8_8_ = MSG[0];
  auVar7._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar7);
  auVar46 = sha256msg1_sha(auVar46,auVar44);
  local_bb8 = auVar47._0_4_;
  iStack_bb4 = auVar47._4_4_;
  iStack_bb0 = auVar47._8_4_;
  iStack_bac = auVar47._12_4_;
  iVar43 = local_bb8 + 0x19a4c116;
  TMP[1] = CONCAT44(iStack_bb4 + 0x1e376c08,iVar43);
  MSG[0] = CONCAT44(iStack_bac + 0x34b0bcb5,iStack_bb0 + 0x2748774c);
  auVar6._8_8_ = MSG[0];
  auVar6._0_8_ = TMP[1];
  auVar48 = sha256rnds2_sha(auVar48,auVar49,auVar6);
  local_bd8 = auVar45._0_4_;
  iStack_bd4 = auVar45._4_4_;
  iStack_bd0 = auVar45._8_4_;
  iStack_bcc = auVar45._12_4_;
  MSG2[1] = CONCAT44(iStack_bd4 + iStack_b70,local_bd8 + iStack_b74);
  MSG1[0]._0_4_ = iStack_bd0 + iStack_b6c;
  MSG1[0]._4_4_ = iStack_bcc + local_bb8;
  auVar33._8_8_ = MSG1[0];
  auVar33._0_8_ = MSG2[1];
  auVar45 = sha256msg2_sha(auVar33,auVar47);
  TMP[1] = CONCAT44(iStack_bac + 0x34b0bcb5,iStack_bb0 + 0x2748774c);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar5._8_8_ = MSG[0];
  auVar5._0_8_ = TMP[1];
  auVar49 = sha256rnds2_sha(auVar49,auVar48,auVar5);
  auVar44 = sha256msg1_sha(auVar44,auVar47);
  local_bf8 = auVar45._0_4_;
  iStack_bf4 = auVar45._4_4_;
  iStack_bf0 = auVar45._8_4_;
  iStack_bec = auVar45._12_4_;
  iVar43 = local_bf8 + 0x391c0cb3;
  TMP[1] = CONCAT44(iStack_bf4 + 0x4ed8aa4a,iVar43);
  MSG[0] = CONCAT44(iStack_bec + 0x682e6ff3,iStack_bf0 + 0x5b9cca4f);
  auVar4._8_8_ = MSG[0];
  auVar4._0_8_ = TMP[1];
  auVar47 = sha256rnds2_sha(auVar48,auVar49,auVar4);
  local_c18 = auVar46._0_4_;
  iStack_c14 = auVar46._4_4_;
  iStack_c10 = auVar46._8_4_;
  iStack_c0c = auVar46._12_4_;
  MSG3[1] = CONCAT44(iStack_c14 + iStack_bb0,local_c18 + iStack_bb4);
  MSG2[0]._0_4_ = iStack_c10 + iStack_bac;
  MSG2[0]._4_4_ = iStack_c0c + local_bf8;
  auVar32._8_8_ = MSG2[0];
  auVar32._0_8_ = MSG3[1];
  auVar46 = sha256msg2_sha(auVar32,auVar45);
  TMP[1] = CONCAT44(iStack_bec + 0x682e6ff3,iStack_bf0 + 0x5b9cca4f);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar3._8_8_ = MSG[0];
  auVar3._0_8_ = TMP[1];
  auVar45 = sha256rnds2_sha(auVar49,auVar47,auVar3);
  local_c38 = auVar46._0_4_;
  iStack_c34 = auVar46._4_4_;
  iStack_c30 = auVar46._8_4_;
  iStack_c2c = auVar46._12_4_;
  iVar43 = local_c38 + 0x748f82ee;
  TMP[1] = CONCAT44(iStack_c34 + 0x78a5636f,iVar43);
  MSG[0] = CONCAT44(iStack_c2c + -0x7338fdf8,iStack_c30 + -0x7b3787ec);
  auVar2._8_8_ = MSG[0];
  auVar2._0_8_ = TMP[1];
  auVar47 = sha256rnds2_sha(auVar47,auVar45,auVar2);
  local_c58 = auVar44._0_4_;
  iStack_c54 = auVar44._4_4_;
  iStack_c50 = auVar44._8_4_;
  iStack_c4c = auVar44._12_4_;
  block = (__m128i *)CONCAT44(iStack_c54 + iStack_bf0,local_c58 + iStack_bf4);
  MSG3[0]._0_4_ = iStack_c50 + iStack_bec;
  MSG3[0]._4_4_ = iStack_c4c + local_c38;
  auVar31._8_8_ = MSG3[0];
  auVar31._0_8_ = block;
  auVar44 = sha256msg2_sha(auVar31,auVar46);
  TMP[1] = CONCAT44(iStack_c2c + -0x7338fdf8,iStack_c30 + -0x7b3787ec);
  MSG[0] = CONCAT44(iVar43,iVar43);
  auVar1._8_8_ = MSG[0];
  auVar1._0_8_ = TMP[1];
  auVar46 = sha256rnds2_sha(auVar45,auVar47,auVar1);
  local_c78 = auVar44._0_4_;
  iStack_c74 = auVar44._4_4_;
  iStack_c70 = auVar44._8_4_;
  iStack_c6c = auVar44._12_4_;
  local_c78 = local_c78 + -0x6f410006;
  TMP[1] = CONCAT44(iStack_c74 + -0x5baf9315,local_c78);
  MSG[0] = CONCAT44(iStack_c6c + -0x398e870e,iStack_c70 + -0x41065c09);
  auVar49._8_8_ = MSG[0];
  auVar49._0_8_ = TMP[1];
  auVar44 = sha256rnds2_sha(auVar47,auVar46,auVar49);
  TMP[1] = CONCAT44(iStack_c6c + -0x398e870e,iStack_c70 + -0x41065c09);
  MSG[0] = CONCAT44(local_c78,local_c78);
  auVar48._8_8_ = MSG[0];
  auVar48._0_8_ = TMP[1];
  auVar46 = sha256rnds2_sha(auVar46,auVar44,auVar48);
  local_c98 = auVar46._0_4_;
  iStack_c94 = auVar46._4_4_;
  iStack_c90 = auVar46._8_4_;
  iStack_c8c = auVar46._12_4_;
  local_ca8 = (int)(*core)[0];
  iStack_ca4 = (int)((ulong)(*core)[0] >> 0x20);
  iStack_ca0 = (int)(*core)[1];
  iStack_c9c = (int)((ulong)(*core)[1] >> 0x20);
  *(int *)*core = local_c98 + local_ca8;
  *(int *)((long)*core + 4) = iStack_c94 + iStack_ca4;
  *(int *)(*core + 1) = iStack_c90 + iStack_ca0;
  *(int *)((long)*core + 0xc) = iStack_c8c + iStack_c9c;
  local_cb8 = auVar44._0_4_;
  iStack_cb4 = auVar44._4_4_;
  iStack_cb0 = auVar44._8_4_;
  iStack_cac = auVar44._12_4_;
  local_cc8 = (int)core[1][0];
  iStack_cc4 = (int)((ulong)core[1][0] >> 0x20);
  iStack_cc0 = (int)core[1][1];
  iStack_cbc = (int)((ulong)core[1][1] >> 0x20);
  *(int *)core[1] = local_cb8 + local_cc8;
  *(int *)((long)core[1] + 4) = iStack_cb4 + iStack_cc4;
  *(int *)(core[1] + 1) = iStack_cb0 + iStack_cc0;
  *(int *)((long)core[1] + 0xc) = iStack_cac + iStack_cbc;
  return;
}

Assistant:

static inline void sha256_ni_block(__m128i *core, const uint8_t *p)
{
    __m128i STATE0, STATE1;
    __m128i MSG, TMP;
    __m128i MSG0, MSG1, MSG2, MSG3;
    const __m128i *block = (const __m128i *)p;
    const __m128i MASK = _mm_set_epi64x(
        0x0c0d0e0f08090a0bULL, 0x0405060700010203ULL);

    /* Load initial values */
    STATE0 = core[0];
    STATE1 = core[1];

    /* Rounds 0-3 */
    MSG = _mm_loadu_si128(block);
    MSG0 = _mm_shuffle_epi8(MSG, MASK);
    MSG = _mm_add_epi32(MSG0, _mm_set_epi64x(
                            0xE9B5DBA5B5C0FBCFULL, 0x71374491428A2F98ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);

    /* Rounds 4-7 */
    MSG1 = _mm_loadu_si128(block + 1);
    MSG1 = _mm_shuffle_epi8(MSG1, MASK);
    MSG = _mm_add_epi32(MSG1, _mm_set_epi64x(
                            0xAB1C5ED5923F82A4ULL, 0x59F111F13956C25BULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG0 = _mm_sha256msg1_epu32(MSG0, MSG1);

    /* Rounds 8-11 */
    MSG2 = _mm_loadu_si128(block + 2);
    MSG2 = _mm_shuffle_epi8(MSG2, MASK);
    MSG = _mm_add_epi32(MSG2, _mm_set_epi64x(
                            0x550C7DC3243185BEULL, 0x12835B01D807AA98ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG1 = _mm_sha256msg1_epu32(MSG1, MSG2);

    /* Rounds 12-15 */
    MSG3 = _mm_loadu_si128(block + 3);
    MSG3 = _mm_shuffle_epi8(MSG3, MASK);
    MSG = _mm_add_epi32(MSG3, _mm_set_epi64x(
                            0xC19BF1749BDC06A7ULL, 0x80DEB1FE72BE5D74ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG3, MSG2, 4);
    MSG0 = _mm_add_epi32(MSG0, TMP);
    MSG0 = _mm_sha256msg2_epu32(MSG0, MSG3);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG2 = _mm_sha256msg1_epu32(MSG2, MSG3);

    /* Rounds 16-19 */
    MSG = _mm_add_epi32(MSG0, _mm_set_epi64x(
                            0x240CA1CC0FC19DC6ULL, 0xEFBE4786E49B69C1ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG0, MSG3, 4);
    MSG1 = _mm_add_epi32(MSG1, TMP);
    MSG1 = _mm_sha256msg2_epu32(MSG1, MSG0);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG3 = _mm_sha256msg1_epu32(MSG3, MSG0);

    /* Rounds 20-23 */
    MSG = _mm_add_epi32(MSG1, _mm_set_epi64x(
                            0x76F988DA5CB0A9DCULL, 0x4A7484AA2DE92C6FULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG1, MSG0, 4);
    MSG2 = _mm_add_epi32(MSG2, TMP);
    MSG2 = _mm_sha256msg2_epu32(MSG2, MSG1);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG0 = _mm_sha256msg1_epu32(MSG0, MSG1);

    /* Rounds 24-27 */
    MSG = _mm_add_epi32(MSG2, _mm_set_epi64x(
                            0xBF597FC7B00327C8ULL, 0xA831C66D983E5152ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG2, MSG1, 4);
    MSG3 = _mm_add_epi32(MSG3, TMP);
    MSG3 = _mm_sha256msg2_epu32(MSG3, MSG2);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG1 = _mm_sha256msg1_epu32(MSG1, MSG2);

    /* Rounds 28-31 */
    MSG = _mm_add_epi32(MSG3, _mm_set_epi64x(
                            0x1429296706CA6351ULL,  0xD5A79147C6E00BF3ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG3, MSG2, 4);
    MSG0 = _mm_add_epi32(MSG0, TMP);
    MSG0 = _mm_sha256msg2_epu32(MSG0, MSG3);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG2 = _mm_sha256msg1_epu32(MSG2, MSG3);

    /* Rounds 32-35 */
    MSG = _mm_add_epi32(MSG0, _mm_set_epi64x(
                            0x53380D134D2C6DFCULL, 0x2E1B213827B70A85ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG0, MSG3, 4);
    MSG1 = _mm_add_epi32(MSG1, TMP);
    MSG1 = _mm_sha256msg2_epu32(MSG1, MSG0);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG3 = _mm_sha256msg1_epu32(MSG3, MSG0);

    /* Rounds 36-39 */
    MSG = _mm_add_epi32(MSG1, _mm_set_epi64x(
                            0x92722C8581C2C92EULL, 0x766A0ABB650A7354ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG1, MSG0, 4);
    MSG2 = _mm_add_epi32(MSG2, TMP);
    MSG2 = _mm_sha256msg2_epu32(MSG2, MSG1);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG0 = _mm_sha256msg1_epu32(MSG0, MSG1);

    /* Rounds 40-43 */
    MSG = _mm_add_epi32(MSG2, _mm_set_epi64x(
                            0xC76C51A3C24B8B70ULL, 0xA81A664BA2BFE8A1ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG2, MSG1, 4);
    MSG3 = _mm_add_epi32(MSG3, TMP);
    MSG3 = _mm_sha256msg2_epu32(MSG3, MSG2);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG1 = _mm_sha256msg1_epu32(MSG1, MSG2);

    /* Rounds 44-47 */
    MSG = _mm_add_epi32(MSG3, _mm_set_epi64x(
                            0x106AA070F40E3585ULL, 0xD6990624D192E819ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG3, MSG2, 4);
    MSG0 = _mm_add_epi32(MSG0, TMP);
    MSG0 = _mm_sha256msg2_epu32(MSG0, MSG3);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG2 = _mm_sha256msg1_epu32(MSG2, MSG3);

    /* Rounds 48-51 */
    MSG = _mm_add_epi32(MSG0, _mm_set_epi64x(
                            0x34B0BCB52748774CULL, 0x1E376C0819A4C116ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG0, MSG3, 4);
    MSG1 = _mm_add_epi32(MSG1, TMP);
    MSG1 = _mm_sha256msg2_epu32(MSG1, MSG0);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);
    MSG3 = _mm_sha256msg1_epu32(MSG3, MSG0);

    /* Rounds 52-55 */
    MSG = _mm_add_epi32(MSG1, _mm_set_epi64x(
                            0x682E6FF35B9CCA4FULL, 0x4ED8AA4A391C0CB3ULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG1, MSG0, 4);
    MSG2 = _mm_add_epi32(MSG2, TMP);
    MSG2 = _mm_sha256msg2_epu32(MSG2, MSG1);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);

    /* Rounds 56-59 */
    MSG = _mm_add_epi32(MSG2, _mm_set_epi64x(
                            0x8CC7020884C87814ULL, 0x78A5636F748F82EEULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    TMP = _mm_alignr_epi8(MSG2, MSG1, 4);
    MSG3 = _mm_add_epi32(MSG3, TMP);
    MSG3 = _mm_sha256msg2_epu32(MSG3, MSG2);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);

    /* Rounds 60-63 */
    MSG = _mm_add_epi32(MSG3, _mm_set_epi64x(
                            0xC67178F2BEF9A3F7ULL, 0xA4506CEB90BEFFFAULL));
    STATE1 = _mm_sha256rnds2_epu32(STATE1, STATE0, MSG);
    MSG = _mm_shuffle_epi32(MSG, 0x0E);
    STATE0 = _mm_sha256rnds2_epu32(STATE0, STATE1, MSG);

    /* Combine state */
    core[0] = _mm_add_epi32(STATE0, core[0]);
    core[1] = _mm_add_epi32(STATE1, core[1]);
}